

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

_Bool init_arrays(aom_film_grain_t *params,int luma_stride,int chroma_stride,int ***pred_pos_luma_p,
                 int ***pred_pos_chroma_p,int **luma_grain_block,int **cb_grain_block,
                 int **cr_grain_block,int **y_line_buf,int **cb_line_buf,int **cr_line_buf,
                 int **y_col_buf,int **cb_col_buf,int **cr_col_buf,int luma_grain_samples,
                 int chroma_grain_samples,int chroma_subsamp_y,int chroma_subsamp_x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int **cb_line_buf_00;
  int *piVar5;
  int **y_line_buf_00;
  void *pvVar6;
  int **ppiVar7;
  int **in_RCX;
  long in_RDI;
  int **in_R8;
  int **in_R9;
  long *in_stack_00000008;
  long *in_stack_00000010;
  long *in_stack_00000018;
  long *in_stack_00000020;
  int **in_stack_00000028;
  int col_1;
  int col;
  int row_2;
  int pos_ar_index;
  int row_1;
  int row;
  int **pred_pos_chroma;
  int **pred_pos_luma;
  int num_pos_chroma;
  int num_pos_luma;
  size_t in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar8;
  int local_68;
  int local_64;
  int **in_stack_ffffffffffffffa0;
  _Bool local_19;
  
  *in_RCX = (int *)0x0;
  *in_R8 = (int *)0x0;
  *in_R9 = (int *)0x0;
  *in_stack_00000008 = 0;
  *in_stack_00000010 = 0;
  *in_stack_00000018 = 0;
  *in_stack_00000020 = 0;
  *in_stack_00000028 = (int *)0x0;
  *_col_1 = (int *)0x0;
  *_row_2 = (int *)0x0;
  *_row_1 = (int **)0x0;
  memset(scaling_lut_y,0,0x400);
  memset(scaling_lut_cb,0,0x400);
  memset(scaling_lut_cr,0,0x400);
  iVar1 = *(int *)(in_RDI + 0x128) * 2 * (*(int *)(in_RDI + 0x128) + 1);
  iVar2 = iVar1;
  if (0 < *(int *)(in_RDI + 0x78)) {
    iVar2 = iVar1 + 1;
  }
  cb_line_buf_00 = (int **)aom_calloc(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (cb_line_buf_00 == (int **)0x0) {
    local_19 = false;
  }
  else {
    for (local_64 = 0; local_64 < iVar1; local_64 = local_64 + 1) {
      piVar5 = (int *)aom_malloc(0x1bdd5e);
      cb_line_buf_00[local_64] = piVar5;
      if (cb_line_buf_00[local_64] == (int *)0x0) {
        dealloc_arrays((aom_film_grain_t *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (int ***)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),_row_1
                       ,_row_2,_col_1,in_stack_00000028,in_stack_ffffffffffffffa0,cb_line_buf_00,
                       (int **)CONCAT44(iVar1,iVar2),in_R9,in_R8,in_RCX);
        return false;
      }
    }
    y_line_buf_00 = (int **)aom_calloc(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    if (y_line_buf_00 == (int **)0x0) {
      dealloc_arrays((aom_film_grain_t *)
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                     (int ***)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),_row_1,
                     _row_2,_col_1,in_stack_00000028,(int **)0x0,cb_line_buf_00,
                     (int **)CONCAT44(iVar1,iVar2),in_R9,in_R8,in_RCX);
      local_19 = false;
    }
    else {
      for (local_68 = 0; local_68 < iVar2; local_68 = local_68 + 1) {
        piVar5 = (int *)aom_malloc(0x1bdee2);
        y_line_buf_00[local_68] = piVar5;
        if (y_line_buf_00[local_68] == (int *)0x0) {
          dealloc_arrays((aom_film_grain_t *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                         (int ***)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         _row_1,_row_2,_col_1,in_stack_00000028,y_line_buf_00,cb_line_buf_00,
                         (int **)CONCAT44(iVar1,iVar2),in_R9,in_R8,in_RCX);
          return false;
        }
      }
      iVar8 = 0;
      for (iVar3 = -*(int *)(in_RDI + 0x128); iVar3 < 0; iVar3 = iVar3 + 1) {
        for (in_stack_ffffffffffffff8c = -*(int *)(in_RDI + 0x128);
            in_stack_ffffffffffffff8c < *(int *)(in_RDI + 0x128) + 1;
            in_stack_ffffffffffffff8c = in_stack_ffffffffffffff8c + 1) {
          *cb_line_buf_00[iVar8] = iVar3;
          cb_line_buf_00[iVar8][1] = in_stack_ffffffffffffff8c;
          cb_line_buf_00[iVar8][2] = 0;
          *y_line_buf_00[iVar8] = iVar3;
          y_line_buf_00[iVar8][1] = in_stack_ffffffffffffff8c;
          y_line_buf_00[iVar8][2] = 0;
          iVar8 = iVar8 + 1;
        }
      }
      for (iVar4 = -*(int *)(in_RDI + 0x128); iVar4 < 0; iVar4 = iVar4 + 1) {
        *cb_line_buf_00[iVar8] = 0;
        cb_line_buf_00[iVar8][1] = iVar4;
        cb_line_buf_00[iVar8][2] = 0;
        *y_line_buf_00[iVar8] = 0;
        y_line_buf_00[iVar8][1] = iVar4;
        y_line_buf_00[iVar8][2] = 0;
        iVar8 = iVar8 + 1;
      }
      if (0 < *(int *)(in_RDI + 0x78)) {
        *y_line_buf_00[iVar8] = 0;
        y_line_buf_00[iVar8][1] = 0;
        y_line_buf_00[iVar8][2] = 1;
      }
      *in_RCX = (int *)cb_line_buf_00;
      *in_R8 = (int *)y_line_buf_00;
      pvVar6 = aom_malloc(0x1be1ce);
      *in_stack_00000018 = (long)pvVar6;
      pvVar6 = aom_malloc(0x1be1fe);
      *in_stack_00000020 = (long)pvVar6;
      piVar5 = (int *)aom_malloc(0x1be22e);
      *in_stack_00000028 = piVar5;
      piVar5 = (int *)aom_malloc(0x1be254);
      *_col_1 = piVar5;
      piVar5 = (int *)aom_malloc(0x1be29a);
      *_row_2 = piVar5;
      ppiVar7 = (int **)aom_malloc(0x1be2e0);
      *_row_1 = ppiVar7;
      piVar5 = (int *)aom_malloc(0x1be2ff);
      *in_R9 = piVar5;
      pvVar6 = aom_malloc(0x1be31b);
      *in_stack_00000008 = (long)pvVar6;
      pvVar6 = aom_malloc(0x1be33a);
      *in_stack_00000010 = (long)pvVar6;
      if ((((((*in_RCX == (int *)0x0) || (*in_R8 == (int *)0x0)) || (*in_stack_00000018 == 0)) ||
           ((*in_stack_00000020 == 0 || (*in_stack_00000028 == (int *)0x0)))) ||
          ((*_col_1 == (int *)0x0 || ((*_row_2 == (int *)0x0 || (*_row_1 == (int **)0x0)))))) ||
         ((*in_R9 == (int *)0x0 || ((*in_stack_00000008 == 0 || (*in_stack_00000010 == 0)))))) {
        dealloc_arrays((aom_film_grain_t *)CONCAT44(iVar8,iVar3),
                       (int ***)CONCAT44(in_stack_ffffffffffffff8c,iVar4),_row_1,_row_2,_col_1,
                       in_stack_00000028,y_line_buf_00,cb_line_buf_00,(int **)CONCAT44(iVar1,iVar2),
                       in_R9,in_R8,in_RCX);
        local_19 = false;
      }
      else {
        local_19 = true;
      }
    }
  }
  return local_19;
}

Assistant:

static bool init_arrays(const aom_film_grain_t *params, int luma_stride,
                        int chroma_stride, int ***pred_pos_luma_p,
                        int ***pred_pos_chroma_p, int **luma_grain_block,
                        int **cb_grain_block, int **cr_grain_block,
                        int **y_line_buf, int **cb_line_buf, int **cr_line_buf,
                        int **y_col_buf, int **cb_col_buf, int **cr_col_buf,
                        int luma_grain_samples, int chroma_grain_samples,
                        int chroma_subsamp_y, int chroma_subsamp_x) {
  *pred_pos_luma_p = NULL;
  *pred_pos_chroma_p = NULL;
  *luma_grain_block = NULL;
  *cb_grain_block = NULL;
  *cr_grain_block = NULL;
  *y_line_buf = NULL;
  *cb_line_buf = NULL;
  *cr_line_buf = NULL;
  *y_col_buf = NULL;
  *cb_col_buf = NULL;
  *cr_col_buf = NULL;

  memset(scaling_lut_y, 0, sizeof(*scaling_lut_y) * 256);
  memset(scaling_lut_cb, 0, sizeof(*scaling_lut_cb) * 256);
  memset(scaling_lut_cr, 0, sizeof(*scaling_lut_cr) * 256);

  int num_pos_luma = 2 * params->ar_coeff_lag * (params->ar_coeff_lag + 1);
  int num_pos_chroma = num_pos_luma;
  if (params->num_y_points > 0) ++num_pos_chroma;

  int **pred_pos_luma;
  int **pred_pos_chroma;

  pred_pos_luma = (int **)aom_calloc(num_pos_luma, sizeof(*pred_pos_luma));
  if (!pred_pos_luma) return false;

  for (int row = 0; row < num_pos_luma; row++) {
    pred_pos_luma[row] = (int *)aom_malloc(sizeof(**pred_pos_luma) * 3);
    if (!pred_pos_luma[row]) {
      dealloc_arrays(params, pred_pos_luma_p, pred_pos_chroma_p,
                     luma_grain_block, cb_grain_block, cr_grain_block,
                     y_line_buf, cb_line_buf, cr_line_buf, y_col_buf,
                     cb_col_buf, cr_col_buf);
      return false;
    }
  }

  pred_pos_chroma =
      (int **)aom_calloc(num_pos_chroma, sizeof(*pred_pos_chroma));
  if (!pred_pos_chroma) {
    dealloc_arrays(params, pred_pos_luma_p, pred_pos_chroma_p, luma_grain_block,
                   cb_grain_block, cr_grain_block, y_line_buf, cb_line_buf,
                   cr_line_buf, y_col_buf, cb_col_buf, cr_col_buf);
    return false;
  }

  for (int row = 0; row < num_pos_chroma; row++) {
    pred_pos_chroma[row] = (int *)aom_malloc(sizeof(**pred_pos_chroma) * 3);
    if (!pred_pos_chroma[row]) {
      dealloc_arrays(params, pred_pos_luma_p, pred_pos_chroma_p,
                     luma_grain_block, cb_grain_block, cr_grain_block,
                     y_line_buf, cb_line_buf, cr_line_buf, y_col_buf,
                     cb_col_buf, cr_col_buf);
      return false;
    }
  }

  int pos_ar_index = 0;

  for (int row = -params->ar_coeff_lag; row < 0; row++) {
    for (int col = -params->ar_coeff_lag; col < params->ar_coeff_lag + 1;
         col++) {
      pred_pos_luma[pos_ar_index][0] = row;
      pred_pos_luma[pos_ar_index][1] = col;
      pred_pos_luma[pos_ar_index][2] = 0;

      pred_pos_chroma[pos_ar_index][0] = row;
      pred_pos_chroma[pos_ar_index][1] = col;
      pred_pos_chroma[pos_ar_index][2] = 0;
      ++pos_ar_index;
    }
  }

  for (int col = -params->ar_coeff_lag; col < 0; col++) {
    pred_pos_luma[pos_ar_index][0] = 0;
    pred_pos_luma[pos_ar_index][1] = col;
    pred_pos_luma[pos_ar_index][2] = 0;

    pred_pos_chroma[pos_ar_index][0] = 0;
    pred_pos_chroma[pos_ar_index][1] = col;
    pred_pos_chroma[pos_ar_index][2] = 0;

    ++pos_ar_index;
  }

  if (params->num_y_points > 0) {
    pred_pos_chroma[pos_ar_index][0] = 0;
    pred_pos_chroma[pos_ar_index][1] = 0;
    pred_pos_chroma[pos_ar_index][2] = 1;
  }

  *pred_pos_luma_p = pred_pos_luma;
  *pred_pos_chroma_p = pred_pos_chroma;

  *y_line_buf = (int *)aom_malloc(sizeof(**y_line_buf) * luma_stride * 2);
  *cb_line_buf = (int *)aom_malloc(sizeof(**cb_line_buf) * chroma_stride *
                                   (2 >> chroma_subsamp_y));
  *cr_line_buf = (int *)aom_malloc(sizeof(**cr_line_buf) * chroma_stride *
                                   (2 >> chroma_subsamp_y));

  *y_col_buf =
      (int *)aom_malloc(sizeof(**y_col_buf) * (luma_subblock_size_y + 2) * 2);
  *cb_col_buf =
      (int *)aom_malloc(sizeof(**cb_col_buf) *
                        (chroma_subblock_size_y + (2 >> chroma_subsamp_y)) *
                        (2 >> chroma_subsamp_x));
  *cr_col_buf =
      (int *)aom_malloc(sizeof(**cr_col_buf) *
                        (chroma_subblock_size_y + (2 >> chroma_subsamp_y)) *
                        (2 >> chroma_subsamp_x));

  *luma_grain_block =
      (int *)aom_malloc(sizeof(**luma_grain_block) * luma_grain_samples);
  *cb_grain_block =
      (int *)aom_malloc(sizeof(**cb_grain_block) * chroma_grain_samples);
  *cr_grain_block =
      (int *)aom_malloc(sizeof(**cr_grain_block) * chroma_grain_samples);
  if (!(*pred_pos_luma_p && *pred_pos_chroma_p && *y_line_buf && *cb_line_buf &&
        *cr_line_buf && *y_col_buf && *cb_col_buf && *cr_col_buf &&
        *luma_grain_block && *cb_grain_block && *cr_grain_block)) {
    dealloc_arrays(params, pred_pos_luma_p, pred_pos_chroma_p, luma_grain_block,
                   cb_grain_block, cr_grain_block, y_line_buf, cb_line_buf,
                   cr_line_buf, y_col_buf, cb_col_buf, cr_col_buf);
    return false;
  }
  return true;
}